

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

void cmd_set_arg(command *cmd,char *name,cmd_arg_type type,cmd_arg_data data)

{
  int iVar1;
  int iVar2;
  cmd_arg *arg;
  wchar_t idx;
  wchar_t first_empty;
  size_t i;
  cmd_arg_type type_local;
  char *name_local;
  command *cmd_local;
  cmd_arg_data data_local;
  
  arg._4_4_ = -1;
  arg._0_4_ = -1;
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                  ,0x21a,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  if (*name == '\0') {
    __assert_fail("name[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                  ,0x21b,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  for (_idx = 0; iVar1 = (int)arg, _idx < 4; _idx = _idx + 1) {
    if ((cmd->arg[_idx].name[0] == '\0') && (arg._4_4_ == -1)) {
      arg._4_4_ = (int)_idx;
    }
    iVar2 = strcmp(cmd->arg[_idx].name,name);
    iVar1 = (int)_idx;
    if (iVar2 == 0) break;
  }
  arg._0_4_ = iVar1;
  if ((arg._4_4_ == -1) && ((int)arg == -1)) {
    __assert_fail("first_empty != -1 || idx != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-core.c"
                  ,0x229,
                  "void cmd_set_arg(struct command *, const char *, enum cmd_arg_type, union cmd_arg_data)"
                 );
  }
  if ((int)arg == -1) {
    arg._0_4_ = arg._4_4_;
  }
  cmd->arg[(int)arg].type = type;
  cmd->arg[(int)arg].data = (cmd_arg_data_conflict)data;
  my_strcpy(cmd->arg[(int)arg].name,name,0x14);
  return;
}

Assistant:

static void cmd_set_arg(struct command *cmd, const char *name,
						enum cmd_arg_type type, union cmd_arg_data data)
{
	size_t i;

	int first_empty = -1;
	int idx = -1;

	assert(name);
	assert(name[0]);

	/* Find an arg that either... */
	for (i = 0; i < CMD_MAX_ARGS; i++) {
		struct cmd_arg *arg = &cmd->arg[i];
		if (!arg->name[0] && first_empty == -1)
			first_empty = i;

		if (streq(arg->name, name)) {
			idx = i;
			break;
		}
	}

	assert(first_empty != -1 || idx != -1);

	if (idx == -1)
		idx = first_empty;

	cmd->arg[idx].type = type;
	cmd->arg[idx].data = data;
	my_strcpy(cmd->arg[idx].name, name, sizeof cmd->arg[0].name);
}